

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void obj_ReadFile(char *fileName,uint fileID)

{
  FILE *pFVar1;
  FILE *pFVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  FileStackNode *pFVar7;
  int *piVar8;
  char *pcVar9;
  int64_t iVar10;
  ulong uVar11;
  ulong uVar12;
  Symbol **ppSVar13;
  SymbolList *pSVar14;
  void *__ptr;
  Symbol *symbol_00;
  Section **fileSections_00;
  Section *pSVar15;
  Symbol **ppSVar16;
  Assertion *assert;
  char *pcVar17;
  char *local_178;
  uint local_168;
  uint local_164;
  char *local_160;
  char *local_150;
  char *local_140;
  char *local_128;
  Assertion *assertion;
  uint32_t i_5;
  int64_t tmpVal_4;
  FILE *tmpFile_4;
  Section *pSStack_d8;
  uint32_t nbAsserts;
  Section *section;
  uint local_c8;
  int32_t sectionID;
  uint32_t i_4;
  uint32_t j;
  uint32_t i_3;
  uint32_t i_2;
  Section **fileSections;
  Symbol *symbol;
  uint32_t i_1;
  uint32_t *nbSymPerSect;
  SymbolList *symbolList;
  Symbol **fileSymbols;
  uint32_t i;
  int64_t tmpVal_3;
  FILE *tmpFile_3;
  int64_t tmpVal_2;
  FILE *tmpFile_2;
  int64_t tmpVal_1;
  FILE *tmpFile_1;
  uint32_t nbSections;
  uint32_t nbSymbols;
  int64_t tmpVal;
  FILE *tmpFile;
  uint32_t revNum;
  int matchedElems;
  FileStackNode *where;
  FILE *pFStack_20;
  int c;
  FILE *file;
  char *pcStack_10;
  uint fileID_local;
  char *fileName_local;
  
  file._4_4_ = fileID;
  pcStack_10 = fileName;
  iVar5 = strcmp("-",fileName);
  if (iVar5 == 0) {
    pFStack_20 = fdopen(0,"rb");
  }
  else {
    pFStack_20 = fopen(pcStack_10,"rb");
  }
  if (pFStack_20 == (FILE *)0x0) {
    err("Could not open file %s",pcStack_10);
  }
  where._4_4_ = getc(pFStack_20);
  ungetc(where._4_4_,pFStack_20);
  if (where._4_4_ == -1) {
    fatal((FileStackNode *)0x0,0,"File \"%s\" is empty!",pcStack_10);
  }
  if (where._4_4_ == 0x52) {
    iVar5 = __isoc99_fscanf(pFStack_20,"RGB9%n",(long)&tmpFile + 4);
    if ((iVar5 == 1) && (tmpFile._4_4_ != 4)) {
      errx("%s: Not a RGBDS object file",pcStack_10);
    }
    if ((beVerbose & 1U) != 0) {
      fprintf(_stderr,"Reading object file %s\n",pcStack_10);
    }
    pFVar1 = pFStack_20;
    iVar10 = readlong((FILE *)pFStack_20);
    pcVar3 = pcStack_10;
    pFVar2 = pFStack_20;
    if (iVar10 == 0x7fffffffffffffff) {
      iVar5 = feof(pFVar1);
      if (iVar5 == 0) {
        piVar8 = __errno_location();
        local_128 = strerror(*piVar8);
      }
      else {
        local_128 = "Unexpected end of file";
      }
      errx("%s: Cannot read revision number: %s",pcVar3,local_128);
    }
    tmpFile._0_4_ = (uint)iVar10;
    if ((uint)tmpFile != 9) {
      pcVar9 = get_package_version_string();
      pcVar17 = "";
      if (9 < (uint)tmpFile) {
        pcVar17 = " or updating rgblink";
      }
      errx("%s: Unsupported object file for rgblink %s; try rebuilding \"%s\"%s (expected revision %d, got %d)"
           ,pcVar3,pcVar9,pcStack_10,pcVar17,9,(uint)tmpFile);
    }
    uVar11 = readlong((FILE *)pFStack_20);
    pcVar3 = pcStack_10;
    pFVar1 = pFStack_20;
    if (uVar11 == 0x7fffffffffffffff) {
      iVar5 = feof(pFVar2);
      if (iVar5 == 0) {
        piVar8 = __errno_location();
        local_140 = strerror(*piVar8);
      }
      else {
        local_140 = "Unexpected end of file";
      }
      errx("%s: Cannot read number of symbols: %s",pcVar3,local_140);
    }
    uVar12 = readlong((FILE *)pFStack_20);
    pcVar3 = pcStack_10;
    pFVar2 = pFStack_20;
    if (uVar12 == 0x7fffffffffffffff) {
      iVar5 = feof(pFVar1);
      if (iVar5 == 0) {
        piVar8 = __errno_location();
        local_150 = strerror(*piVar8);
      }
      else {
        local_150 = "Unexpected end of file";
      }
      errx("%s: Cannot read number of sections: %s",pcVar3,local_150);
    }
    uVar6 = (uint)uVar12;
    nbSectionsToAssign = (uVar12 & 0xffffffff) + nbSectionsToAssign;
    iVar10 = readlong((FILE *)pFStack_20);
    pcVar3 = pcStack_10;
    if (iVar10 == 0x7fffffffffffffff) {
      iVar5 = feof(pFVar2);
      if (iVar5 == 0) {
        piVar8 = __errno_location();
        local_160 = strerror(*piVar8);
      }
      else {
        local_160 = "Unexpected end of file";
      }
      errx("%s: Cannot read number of nodes: %s",pcVar3,local_160);
    }
    nodes[file._4_4_].nbNodes = (uint32_t)iVar10;
    pFVar7 = (FileStackNode *)calloc((ulong)nodes[file._4_4_].nbNodes,0x20);
    nodes[file._4_4_].nodes = pFVar7;
    if (nodes[file._4_4_].nodes == (FileStackNode *)0x0) {
      err("Failed to get memory for %s\'s nodes",pcStack_10);
    }
    if ((beVerbose & 1U) != 0) {
      fprintf(_stderr,"Reading %u nodes...\n",(ulong)nodes[file._4_4_].nbNodes);
    }
    fileSymbols._4_4_ = nodes[file._4_4_].nbNodes;
    while (fileSymbols._4_4_ != 0) {
      readFileStackNode((FILE *)pFStack_20,nodes[file._4_4_].nodes,fileSymbols._4_4_ - 1,pcStack_10)
      ;
      fileSymbols._4_4_ = fileSymbols._4_4_ - 1;
    }
    ppSVar13 = (Symbol **)malloc((uVar11 & 0xffffffff) * 8 + 1);
    if (ppSVar13 == (Symbol **)0x0) {
      err("Failed to get memory for %s\'s symbols",pcStack_10);
    }
    pSVar14 = (SymbolList *)malloc(0x18);
    if (pSVar14 == (SymbolList *)0x0) {
      err("Failed to register %s\'s symbol list",pcStack_10);
    }
    pSVar14->symbolList = ppSVar13;
    pSVar14->nbSymbols = uVar11 & 0xffffffff;
    pSVar14->next = symbolLists;
    local_164 = uVar6;
    if (uVar6 == 0) {
      local_164 = 1;
    }
    symbolLists = pSVar14;
    __ptr = calloc((ulong)local_164,4);
    if ((beVerbose & 1U) != 0) {
      fprintf(_stderr,"Reading %u symbols...\n",uVar11 & 0xffffffff);
    }
    for (symbol._4_4_ = 0; symbol._4_4_ < (uint)uVar11; symbol._4_4_ = symbol._4_4_ + 1) {
      symbol_00 = (Symbol *)malloc(0x38);
      if (symbol_00 == (Symbol *)0x0) {
        err("%s: Couldn\'t create new symbol",pcStack_10);
      }
      readSymbol((FILE *)pFStack_20,symbol_00,pcStack_10,nodes[file._4_4_].nodes);
      ppSVar13[symbol._4_4_] = symbol_00;
      if (symbol_00->type == SYMTYPE_EXPORT) {
        sym_AddSymbol(symbol_00);
      }
      if (symbol_00->sectionID != -1) {
        *(int *)((long)__ptr + (long)symbol_00->sectionID * 4) =
             *(int *)((long)__ptr + (long)symbol_00->sectionID * 4) + 1;
      }
    }
    local_168 = uVar6;
    if (uVar6 == 0) {
      local_168 = 1;
    }
    fileSections_00 = (Section **)malloc((ulong)local_168 << 3);
    if ((beVerbose & 1U) != 0) {
      fprintf(_stderr,"Reading %u sections...\n",uVar12 & 0xffffffff);
    }
    for (j = 0; j < uVar6; j = j + 1) {
      pSVar15 = (Section *)malloc(0x60);
      fileSections_00[j] = pSVar15;
      if (fileSections_00[j] == (Section *)0x0) {
        err("%s: Couldn\'t create new section",pcStack_10);
      }
      fileSections_00[j]->nextu = (Section *)0x0;
      readSection((FILE *)pFStack_20,fileSections_00[j],pcStack_10,nodes[file._4_4_].nodes);
      fileSections_00[j]->fileSymbols = ppSVar13;
      if (*(int *)((long)__ptr + (ulong)j * 4) == 0) {
        fileSections_00[j]->symbols = (Symbol **)0x0;
      }
      else {
        ppSVar16 = (Symbol **)malloc((ulong)*(uint *)((long)__ptr + (ulong)j * 4) << 3);
        fileSections_00[j]->symbols = ppSVar16;
        if (fileSections_00[j]->symbols == (Symbol **)0x0) {
          err("%s: Couldn\'t link to symbols",pcStack_10);
        }
      }
      fileSections_00[j]->nbSymbols = 0;
      sect_AddSection(fileSections_00[j]);
    }
    free(__ptr);
    for (i_4 = 0; i_4 < uVar6; i_4 = i_4 + 1) {
      bVar4 = sect_HasData(fileSections_00[i_4]->type);
      if (bVar4) {
        for (sectionID = 0; (uint)sectionID < fileSections_00[i_4]->nbPatches;
            sectionID = sectionID + 1) {
          linkPatchToPCSect(fileSections_00[i_4]->patches + (uint)sectionID,fileSections_00);
        }
      }
    }
    for (local_c8 = 0; pFVar1 = pFStack_20, local_c8 < (uint)uVar11; local_c8 = local_c8 + 1) {
      if (ppSVar13[local_c8]->sectionID == -1) {
        ppSVar13[local_c8]->section = (Section *)0x0;
      }
      else {
        pSStack_d8 = fileSections_00[ppSVar13[local_c8]->sectionID];
        linkSymToSect(ppSVar13[local_c8],pSStack_d8);
        if (pSStack_d8->modifier != SECTION_NORMAL) {
          if (pSStack_d8->modifier == SECTION_FRAGMENT) {
            (ppSVar13[local_c8]->field_6).offset =
                 (uint)pSStack_d8->offset + (ppSVar13[local_c8]->field_6).offset;
          }
          pSStack_d8 = getMainSection(pSStack_d8);
        }
        ppSVar13[local_c8]->section = pSStack_d8;
      }
    }
    uVar11 = readlong((FILE *)pFStack_20);
    pcVar3 = pcStack_10;
    if (uVar11 == 0x7fffffffffffffff) {
      iVar5 = feof(pFVar1);
      if (iVar5 == 0) {
        piVar8 = __errno_location();
        local_178 = strerror(*piVar8);
      }
      else {
        local_178 = "Unexpected end of file";
      }
      errx("%s: Cannot read number of assertions: %s",pcVar3,local_178);
    }
    if ((beVerbose & 1U) != 0) {
      fprintf(_stderr,"Reading %u assertions...\n",uVar11 & 0xffffffff);
    }
    for (assertion._4_4_ = 0; assertion._4_4_ < (uint)uVar11; assertion._4_4_ = assertion._4_4_ + 1)
    {
      assert = (Assertion *)malloc(0x48);
      if (assert == (Assertion *)0x0) {
        err("%s: Couldn\'t create new assertion",pcStack_10);
      }
      readAssertion((FILE *)pFStack_20,assert,pcStack_10,assertion._4_4_,nodes[file._4_4_].nodes);
      linkPatchToPCSect((Patch *)assert,fileSections_00);
      assert->fileSymbols = ppSVar13;
      assert->next = assertions;
      assertions = assert;
    }
    free(fileSections_00);
    fclose(pFStack_20);
  }
  else {
    nodes[file._4_4_].nbNodes = 1;
    pFVar7 = (FileStackNode *)malloc((ulong)nodes[file._4_4_].nbNodes << 5);
    pcVar3 = pcStack_10;
    nodes[file._4_4_].nodes = pFVar7;
    if (nodes[file._4_4_].nodes == (FileStackNode *)0x0) {
      err("Failed to get memory for %s\'s nodes",pcStack_10);
    }
    _revNum = nodes[file._4_4_].nodes;
    if (_revNum == (FileStackNode *)0x0) {
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      fatal((FileStackNode *)0x0,0,"Failed to alloc fstack node for \"%s\": %s",pcVar3,pcVar9);
    }
    _revNum->parent = (FileStackNode *)0x0;
    _revNum->type = NODE_FILE;
    pcVar9 = strdup(pcStack_10);
    pcVar3 = pcStack_10;
    (_revNum->field_3).name = pcVar9;
    if ((_revNum->field_3).name == (char *)0x0) {
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      fatal((FileStackNode *)0x0,0,"Failed to duplicate \"%s\"\'s name: %s",pcVar3,pcVar9);
    }
    sdobj_ReadFile(_revNum,(FILE *)pFStack_20);
  }
  return;
}

Assistant:

void obj_ReadFile(char const *fileName, unsigned int fileID)
{
	FILE *file;

	if (strcmp("-", fileName) != 0)
		file = fopen(fileName, "rb");
	else
		file = fdopen(STDIN_FILENO, "rb"); // `stdin` is in text mode by default

	if (!file)
		err("Could not open file %s", fileName);

	// First, check if the object is a RGBDS object or a SDCC one. If the first byte is 'R',
	// we'll assume it's a RGBDS object file, and otherwise, that it's a SDCC object file.
	int c = getc(file);

	ungetc(c, file); // Guaranteed to work
	switch (c) {
	case EOF:
		fatal(NULL, 0, "File \"%s\" is empty!", fileName);

	case 'R':
		break;

	default: // This is (probably) a SDCC object file, defer the rest of detection to it
		// Since SDCC does not provide line info, everything will be reported as coming from the
		// object file. It's better than nothing.
		nodes[fileID].nbNodes = 1;
		nodes[fileID].nodes =
			(struct FileStackNode *)malloc(sizeof(nodes[fileID].nodes[0]) * nodes[fileID].nbNodes);
		if (!nodes[fileID].nodes)
			err("Failed to get memory for %s's nodes", fileName);
		struct FileStackNode *where = &nodes[fileID].nodes[0];

		if (!where)
			fatal(NULL, 0, "Failed to alloc fstack node for \"%s\": %s", fileName, strerror(errno));
		where->parent = NULL;
		where->type = NODE_FILE;
		where->name = strdup(fileName);
		if (!where->name)
			fatal(NULL, 0, "Failed to duplicate \"%s\"'s name: %s", fileName, strerror(errno));

		sdobj_ReadFile(where, file);
		return;
	}

	// Begin by reading the magic bytes
	int matchedElems;

	if (fscanf(file, RGBDS_OBJECT_VERSION_STRING "%n", &matchedElems) == 1
	 && matchedElems != strlen(RGBDS_OBJECT_VERSION_STRING))
		errx("%s: Not a RGBDS object file", fileName);

	verbosePrint("Reading object file %s\n",
		     fileName);

	uint32_t revNum;

	tryReadlong(revNum, file, "%s: Cannot read revision number: %s",
		    fileName);
	if (revNum != RGBDS_OBJECT_REV)
		errx("%s: Unsupported object file for rgblink %s; try rebuilding \"%s\"%s"
			" (expected revision %d, got %d)", fileName, get_package_version_string(),
			fileName, revNum > RGBDS_OBJECT_REV ? " or updating rgblink" : "",
			RGBDS_OBJECT_REV, revNum);

	uint32_t nbSymbols;
	uint32_t nbSections;

	tryReadlong(nbSymbols, file, "%s: Cannot read number of symbols: %s",
		    fileName);
	tryReadlong(nbSections, file, "%s: Cannot read number of sections: %s",
		    fileName);

	nbSectionsToAssign += nbSections;

	tryReadlong(nodes[fileID].nbNodes, file, "%s: Cannot read number of nodes: %s", fileName);
	nodes[fileID].nodes =
		(struct FileStackNode *)calloc(nodes[fileID].nbNodes, sizeof(nodes[fileID].nodes[0]));
	if (!nodes[fileID].nodes)
		err("Failed to get memory for %s's nodes", fileName);
	verbosePrint("Reading %u nodes...\n", nodes[fileID].nbNodes);
	for (uint32_t i = nodes[fileID].nbNodes; i--; )
		readFileStackNode(file, nodes[fileID].nodes, i, fileName);

	// This file's symbols, kept to link sections to them
	struct Symbol **fileSymbols = (struct Symbol **)malloc(sizeof(*fileSymbols) * nbSymbols + 1);

	if (!fileSymbols)
		err("Failed to get memory for %s's symbols", fileName);

	struct SymbolList *symbolList = (struct SymbolList *)malloc(sizeof(*symbolList));

	if (!symbolList)
		err("Failed to register %s's symbol list", fileName);
	symbolList->symbolList = fileSymbols;
	symbolList->nbSymbols = nbSymbols;
	symbolList->next = symbolLists;
	symbolLists = symbolList;

	uint32_t *nbSymPerSect = (uint32_t *)calloc(nbSections ? nbSections : 1,
					sizeof(*nbSymPerSect));

	verbosePrint("Reading %" PRIu32 " symbols...\n", nbSymbols);
	for (uint32_t i = 0; i < nbSymbols; i++) {
		// Read symbol
		struct Symbol *symbol = (struct Symbol *)malloc(sizeof(*symbol));

		if (!symbol)
			err("%s: Couldn't create new symbol", fileName);
		readSymbol(file, symbol, fileName, nodes[fileID].nodes);

		fileSymbols[i] = symbol;
		if (symbol->type == SYMTYPE_EXPORT)
			sym_AddSymbol(symbol);
		if (symbol->sectionID != -1)
			nbSymPerSect[symbol->sectionID]++;
	}

	// This file's sections, stored in a table to link symbols to them
	struct Section **fileSections =
		(struct Section **)malloc(sizeof(*fileSections) * (nbSections ? nbSections : 1));

	verbosePrint("Reading %" PRIu32 " sections...\n", nbSections);
	for (uint32_t i = 0; i < nbSections; i++) {
		// Read section
		fileSections[i] = (struct Section *)malloc(sizeof(*fileSections[i]));
		if (!fileSections[i])
			err("%s: Couldn't create new section", fileName);

		fileSections[i]->nextu = NULL;
		readSection(file, fileSections[i], fileName, nodes[fileID].nodes);
		fileSections[i]->fileSymbols = fileSymbols;
		if (nbSymPerSect[i]) {
			fileSections[i]->symbols =
				(struct Symbol **)malloc(nbSymPerSect[i] * sizeof(*fileSections[i]->symbols));
			if (!fileSections[i]->symbols)
				err("%s: Couldn't link to symbols",
				    fileName);
		} else {
			fileSections[i]->symbols = NULL;
		}
		fileSections[i]->nbSymbols = 0;

		sect_AddSection(fileSections[i]);
	}

	free(nbSymPerSect);

	// Give patches' PC section pointers to their sections
	for (uint32_t i = 0; i < nbSections; i++) {
		if (sect_HasData(fileSections[i]->type)) {
			for (uint32_t j = 0; j < fileSections[i]->nbPatches; j++)
				linkPatchToPCSect(&fileSections[i]->patches[j], fileSections);
		}
	}

	// Give symbols' section pointers to their sections
	for (uint32_t i = 0; i < nbSymbols; i++) {
		int32_t sectionID = fileSymbols[i]->sectionID;

		if (sectionID == -1) {
			fileSymbols[i]->section = NULL;
		} else {
			struct Section *section = fileSections[sectionID];

			// Give the section a pointer to the symbol as well
			linkSymToSect(fileSymbols[i], section);

			if (section->modifier != SECTION_NORMAL) {
				if (section->modifier == SECTION_FRAGMENT)
					// Add the fragment's offset to the symbol's
					fileSymbols[i]->offset += section->offset;
				section = getMainSection(section);
			}
			fileSymbols[i]->section = section;
		}
	}

	uint32_t nbAsserts;

	tryReadlong(nbAsserts, file, "%s: Cannot read number of assertions: %s",
		    fileName);
	verbosePrint("Reading %" PRIu32 " assertions...\n", nbAsserts);
	for (uint32_t i = 0; i < nbAsserts; i++) {
		struct Assertion *assertion = (struct Assertion *)malloc(sizeof(*assertion));

		if (!assertion)
			err("%s: Couldn't create new assertion", fileName);
		readAssertion(file, assertion, fileName, i, nodes[fileID].nodes);
		linkPatchToPCSect(&assertion->patch, fileSections);
		assertion->fileSymbols = fileSymbols;
		assertion->next = assertions;
		assertions = assertion;
	}

	free(fileSections);
	fclose(file);
}